

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O3

CVmTimeZone * __thiscall CVmTimeZoneCache::parse_zone(CVmTimeZoneCache *this,char *name,size_t len)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  CVmHashTable *this_00;
  int iVar5;
  char *__s;
  int iVar6;
  CVmTimeZone *pCVar7;
  size_t sVar8;
  ZoneHashEntry *pZVar9;
  size_t sVar10;
  tm *ptVar11;
  long lVar12;
  size_t sVar13;
  char cVar14;
  long lVar15;
  undefined8 uStack_1a0;
  int iStack_194;
  undefined8 uStack_190;
  os_tzinfo_t oStack_188;
  ZoneSearchSpec ZStack_12c;
  os_tzinfo_t oStack_114;
  char acStack_b8 [136];
  
  if (len != 0 && name != (char *)0x0) {
    if (len == 6) {
      if (*(short *)(name + 4) == 0x6c61 && *(int *)name == 0x636f6c3a) {
        pCVar7 = get_local_zone(this);
        return pCVar7;
      }
      pCVar7 = parse_zone_2(this,name,6);
      return pCVar7;
    }
    iVar6 = (int)len;
    if (iVar6 == 1) {
      iVar6 = memicmp(name,"z",len);
      sVar13 = len;
      if (iVar6 == 0) {
LAB_00259910:
        pCVar7 = get_gmtofs_zone(this,0);
        return pCVar7;
      }
    }
    else {
      sVar13 = 1;
      if (iVar6 + -1 < 0) {
        sVar13 = len;
      }
      memicmp(name,"z",sVar13);
      if (iVar6 == 3) {
        iVar6 = memicmp(name,"utc",len);
        if ((iVar6 == 0) || (iVar6 = memicmp(name,"gmt",len), iVar6 == 0)) goto LAB_00259910;
        goto LAB_00259891;
      }
      sVar13 = 3;
      if (iVar6 + -3 < 0) {
        sVar13 = len;
      }
    }
    memicmp(name,"utc",sVar13);
    memicmp(name,"gmt",sVar13);
LAB_00259891:
    pCVar7 = parse_zone_hhmmss(this,"",name,len);
    if (((pCVar7 == (CVmTimeZone *)0x0) &&
        (pCVar7 = parse_zone_hhmmss(this,"utc",name,len), pCVar7 == (CVmTimeZone *)0x0)) &&
       (pCVar7 = parse_zone_posixTZ(this,name,len), pCVar7 == (CVmTimeZone *)0x0)) {
      pCVar7 = get_db_zone(G_tzcache_X,name,len);
      return pCVar7;
    }
    return pCVar7;
  }
  if (this->local_zone_ != (CVmTimeZone *)0x0) {
    return this->local_zone_;
  }
  pcVar4 = this->local_zone_name_;
  if (pcVar4 == (char *)0x0) {
LAB_00259385:
    uStack_1a0 = 0x259397;
    iVar6 = os_get_zoneinfo_key(acStack_b8,0x80);
    if (iVar6 == 0) goto LAB_002593df;
    uStack_1a0 = 0x2593a3;
    iVar6 = load_db_index(this);
    if (iVar6 == 0) goto LAB_002593df;
    this_00 = this->db_tab_;
    uStack_1a0 = 0x2593bb;
    sVar8 = strlen(acStack_b8);
    uStack_1a0 = 0x2593c9;
    pZVar9 = (ZoneHashEntry *)CVmHashTable::find(this_00,acStack_b8,sVar8);
    if (pZVar9 == (ZoneHashEntry *)0x0) goto LAB_002593df;
    uStack_1a0 = 0x2593d6;
    pCVar7 = CVmTimeZone::load(pZVar9);
    this->local_zone_ = pCVar7;
  }
  else {
    uStack_1a0 = 0x259352;
    sVar8 = strlen(pcVar4);
    uStack_1a0 = 0x259360;
    pCVar7 = parse_zone_2(this,pcVar4,sVar8);
    if (pCVar7 == (CVmTimeZone *)0x0) {
      pCVar7 = this->local_zone_;
    }
    else {
      if (pCVar7->hashentry_ == (ZoneHashEntry *)0x0) {
        pCVar7 = (CVmTimeZone *)0x0;
      }
      else {
        uStack_1a0 = 0x259372;
        pCVar7 = CVmTimeZone::load(pCVar7->hashentry_);
      }
      this->local_zone_ = pCVar7;
    }
    if (pCVar7 == (CVmTimeZone *)0x0) goto LAB_00259385;
LAB_002593df:
    pCVar7 = this->local_zone_;
  }
  if (pCVar7 != (CVmTimeZone *)0x0) {
    return pCVar7;
  }
  uStack_1a0 = 0x2593f9;
  iVar6 = os_get_timezone_info(&oStack_114);
  if (iVar6 == 0) {
    pCVar7 = this->local_zone_;
  }
  else {
    pcVar4 = oStack_114.std_abbr;
    __s = oStack_114.dst_abbr;
    if (((oStack_114.std_ofs == oStack_114.dst_ofs) || (oStack_114.std_abbr[0] == '\0')) ||
       (oStack_114.dst_abbr[0] == '\0')) {
      oStack_188._0_8_ = oStack_188._0_8_ & 0xffffffffffffff00;
      iVar6 = oStack_114.dst_ofs;
      if (oStack_114.is_dst == 0) {
        iVar6 = oStack_114.std_ofs;
        __s = pcVar4;
      }
      cVar14 = 'D';
      if (oStack_114.is_dst == 0) {
        cVar14 = 'S';
      }
      uStack_1a0 = 0x259529;
      sVar10 = strlen(__s);
      sVar8 = 0xf;
      if (sVar10 < 0xf) {
        sVar8 = sVar10;
      }
      uStack_1a0 = 0x259545;
      memcpy(&oStack_188,__s,sVar8);
      oStack_188.std_abbr[sVar8 - 8] = '\0';
      oStack_188.std_abbr[0xc] = cVar14;
      oStack_188.std_abbr._8_4_ = iVar6 * 1000;
      iVar6 = 1;
    }
    else {
      lVar12 = 0x14;
      do {
        *(undefined1 *)((long)&uStack_1a0 + lVar12 + 4) = 0;
        *(undefined4 *)((long)&uStack_190 + lVar12 + 4) = 0x7fffffff;
        oStack_188.std_abbr[lVar12 + -8] = 'S';
        lVar12 = lVar12 + 0x18;
      } while (lVar12 != 0x44);
      iStack_194 = oStack_114.std_ofs * 1000;
      uStack_1a0 = 0x259471;
      sVar8 = strlen(pcVar4);
      if (0xe < sVar8) {
        sVar8 = 0xf;
      }
      uStack_1a0 = 0x259491;
      memcpy(&oStack_188,pcVar4,sVar8);
      oStack_188.std_abbr[sVar8 - 8] = '\0';
      oStack_188.std_abbr[0xc] = 'S';
      oStack_188.std_abbr._8_4_ = iStack_194;
      uStack_1a0 = 0x2594bb;
      sVar10 = strlen(__s);
      sVar8 = 0xf;
      if (sVar10 < 0xf) {
        sVar8 = sVar10;
      }
      uStack_1a0 = 0x2594d1;
      memcpy(oStack_188.dst_abbr,__s,sVar8);
      oStack_188.dst_abbr[sVar8] = '\0';
      oStack_188.dst_start.yday._0_1_ = 0x44;
      oStack_188.dst_start.jday = oStack_114.dst_ofs * 1000;
      iVar6 = 2;
    }
    uStack_1a0 = 0x25956b;
    pZVar9 = search(this,(ZoneSearchSpec *)&oStack_188,iVar6);
    if (pZVar9 == (ZoneHashEntry *)0x0) {
      uStack_1a0 = 0x2596cf;
      pCVar7 = (CVmTimeZone *)operator_new(0x68);
      uStack_1a0 = 0x2596e2;
      CVmTimeZone::CVmTimeZone(pCVar7,&oStack_114);
      goto LAB_002597d5;
    }
    uStack_1a0 = 0x25957c;
    pCVar7 = CVmTimeZone::load(pZVar9);
    this->local_zone_ = pCVar7;
  }
  if (pCVar7 != (CVmTimeZone *)0x0) {
    return pCVar7;
  }
  uStack_1a0 = 0x259593;
  uStack_190 = time((time_t *)0x0);
  uStack_1a0 = 0x2595a0;
  ptVar11 = localtime(&uStack_190);
  uStack_1a0 = 0x2595c2;
  strftime(acStack_b8,0x80,"%Z",ptVar11);
  if (acStack_b8[0] == '\0') {
    pCVar7 = this->local_zone_;
  }
  else {
    iVar6 = ptVar11->tm_hour;
    iVar1 = ptVar11->tm_min;
    iVar2 = ptVar11->tm_sec;
    lVar12 = (long)ptVar11->tm_yday + (long)ptVar11->tm_year * 0x16e;
    cVar14 = 'D';
    if (ptVar11->tm_isdst == 0) {
      cVar14 = 'S';
    }
    uStack_1a0 = 0x25960d;
    ptVar11 = gmtime(&uStack_190);
    iVar3 = ptVar11->tm_sec;
    lVar15 = (long)ptVar11->tm_yday + (long)ptVar11->tm_year * 0x16e;
    iVar5 = iVar3 + -0x15180;
    if (lVar12 <= lVar15) {
      iVar5 = iVar3;
    }
    if (lVar12 < lVar15) {
      iVar5 = iVar3 + 0x15180;
    }
    iVar6 = (iVar1 * 0x3c + iVar6 * 0xe10 + iVar2) -
            (iVar5 + ptVar11->tm_min * 0x3c + ptVar11->tm_hour * 0xe10);
    ZStack_12c.gmtofs = iVar6 * 1000;
    uStack_1a0 = 0x259673;
    ZStack_12c.dst = cVar14;
    sVar8 = strlen(acStack_b8);
    if (0xe < sVar8) {
      sVar8 = 0xf;
    }
    uStack_1a0 = 0x259697;
    memcpy(&ZStack_12c,acStack_b8,sVar8);
    ZStack_12c.abbr[sVar8] = '\0';
    uStack_1a0 = 0x2596ac;
    pZVar9 = search(this,&ZStack_12c,1);
    if (pZVar9 == (ZoneHashEntry *)0x0) {
      oStack_188.dst_end.month = 0;
      oStack_188.dst_end.week = 0;
      oStack_188.dst_end.day = 0;
      oStack_188.dst_end.time = 0;
      oStack_188.dst_start.day = 0;
      oStack_188.dst_start.time = 0;
      oStack_188.dst_end.jday = 0;
      oStack_188.dst_end.yday = 0;
      oStack_188.dst_start.jday = 0;
      oStack_188.dst_start.yday = 0;
      oStack_188.dst_start.month = 0;
      oStack_188.dst_start.week = 0;
      oStack_188.dst_abbr[0] = '\0';
      oStack_188.dst_abbr[1] = '\0';
      oStack_188.dst_abbr[2] = '\0';
      oStack_188.dst_abbr[3] = '\0';
      oStack_188.dst_abbr[4] = '\0';
      oStack_188.dst_abbr[5] = '\0';
      oStack_188.dst_abbr[6] = '\0';
      oStack_188.dst_abbr[7] = '\0';
      oStack_188.dst_abbr[8] = '\0';
      oStack_188.dst_abbr[9] = '\0';
      oStack_188.dst_abbr[10] = '\0';
      oStack_188.dst_abbr[0xb] = '\0';
      oStack_188.dst_abbr[0xc] = '\0';
      oStack_188.dst_abbr[0xd] = '\0';
      oStack_188.dst_abbr[0xe] = '\0';
      oStack_188.dst_abbr[0xf] = '\0';
      oStack_188.std_abbr[0] = '\0';
      oStack_188.std_abbr[1] = '\0';
      oStack_188.std_abbr[2] = '\0';
      oStack_188.std_abbr[3] = '\0';
      oStack_188.std_abbr[4] = '\0';
      oStack_188.std_abbr[5] = '\0';
      oStack_188.std_abbr[6] = '\0';
      oStack_188.std_abbr[7] = '\0';
      oStack_188.std_abbr[8] = '\0';
      oStack_188.std_abbr[9] = '\0';
      oStack_188.std_abbr[10] = '\0';
      oStack_188.std_abbr[0xb] = '\0';
      oStack_188.std_abbr[0xc] = '\0';
      oStack_188.std_abbr[0xd] = '\0';
      oStack_188.std_abbr[0xe] = '\0';
      oStack_188.std_abbr[0xf] = '\0';
      oStack_188.dst_ofs = iVar6;
      oStack_188.std_ofs = iVar6;
      uStack_1a0 = 0x25972f;
      sVar10 = strlen(acStack_b8);
      sVar8 = 0xf;
      if (sVar10 < 0xf) {
        sVar8 = sVar10;
      }
      uStack_1a0 = 0x259745;
      memcpy(oStack_188.std_abbr,acStack_b8,sVar8);
      oStack_188.std_abbr[sVar8] = '\0';
      uStack_1a0 = 0x25975f;
      memcpy(oStack_188.dst_abbr,acStack_b8,sVar8);
      oStack_188.dst_abbr[sVar8] = '\0';
      oStack_188.is_dst = ptVar11->tm_isdst;
      uStack_1a0 = 0x259777;
      pCVar7 = (CVmTimeZone *)operator_new(0x68);
      uStack_1a0 = 0x259787;
      CVmTimeZone::CVmTimeZone(pCVar7,&oStack_188);
      this->local_zone_ = pCVar7;
    }
    else {
      uStack_1a0 = 0x2596b9;
      pCVar7 = CVmTimeZone::load(pZVar9);
      this->local_zone_ = pCVar7;
    }
  }
  if (pCVar7 != (CVmTimeZone *)0x0) {
    return pCVar7;
  }
  oStack_188.std_ofs = 0;
  oStack_188.dst_ofs = 0;
  oStack_188.dst_end.day = 0;
  oStack_188.dst_end.time = 0;
  oStack_188.is_dst = 0;
  oStack_188.dst_end.jday = 0;
  oStack_188.dst_end.yday = 0;
  oStack_188.dst_end.month = 0;
  oStack_188.dst_end.week = 0;
  oStack_188.dst_start.month = 0;
  oStack_188.dst_start.week = 0;
  oStack_188.dst_start.day = 0;
  oStack_188.dst_start.time = 0;
  oStack_188.dst_abbr[8] = '\0';
  oStack_188.dst_abbr[9] = '\0';
  oStack_188.dst_abbr[10] = '\0';
  oStack_188.dst_abbr[0xb] = '\0';
  oStack_188.dst_abbr[0xc] = '\0';
  oStack_188.dst_abbr[0xd] = '\0';
  oStack_188.dst_abbr[0xe] = '\0';
  oStack_188.dst_abbr[0xf] = '\0';
  oStack_188.dst_start.jday = 0;
  oStack_188.dst_start.yday = 0;
  oStack_188.std_abbr[8] = '\0';
  oStack_188.std_abbr[9] = '\0';
  oStack_188.std_abbr[10] = '\0';
  oStack_188.std_abbr[0xb] = '\0';
  oStack_188.std_abbr[0xc] = '\0';
  oStack_188.std_abbr[0xd] = '\0';
  oStack_188.std_abbr[0xe] = '\0';
  oStack_188.std_abbr[0xf] = '\0';
  oStack_188.dst_abbr[0] = '\0';
  oStack_188.dst_abbr[1] = '\0';
  oStack_188.dst_abbr[2] = '\0';
  oStack_188.dst_abbr[3] = '\0';
  oStack_188.dst_abbr[4] = '\0';
  oStack_188.dst_abbr[5] = '\0';
  oStack_188.dst_abbr[6] = '\0';
  oStack_188.dst_abbr[7] = '\0';
  builtin_strncpy(oStack_188.std_abbr,"UTC",4);
  oStack_188.std_abbr[4] = '\0';
  oStack_188.std_abbr[5] = '\0';
  oStack_188.std_abbr[6] = '\0';
  oStack_188.std_abbr[7] = '\0';
  uStack_1a0 = 0x2597c7;
  pCVar7 = (CVmTimeZone *)operator_new(0x68);
  uStack_1a0 = 0x2597d5;
  CVmTimeZone::CVmTimeZone(pCVar7,&oStack_188);
LAB_002597d5:
  this->local_zone_ = pCVar7;
  return pCVar7;
}

Assistant:

CVmTimeZone *CVmTimeZoneCache::parse_zone(VMG_ const char *name, size_t len)
{
    /* treat a null, empty string, or ":local" as the local zone */
    if (name == 0 || len == 0
        || (len == 6 && memcmp(name, ":local", 6) == 0))
        return get_local_zone(vmg0_);

    /* look for all names other than the ":local" pseudo-name */
    return parse_zone_2(vmg_ name, len);
}